

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O0

int __thiscall ncnn::Gemm_x86_avx::create_pipeline(Gemm_x86_avx *this,Option *opt)

{
  int iVar1;
  undefined8 uVar2;
  int *piVar3;
  undefined8 *puVar4;
  void **ppvVar5;
  byte *in_RSI;
  long in_RDI;
  bool bVar6;
  int in_stack_00000088;
  int in_stack_0000008c;
  int in_stack_00000090;
  int in_stack_00000094;
  Mat *in_stack_00000098;
  Mat *in_stack_000000a0;
  int i_1;
  int size;
  Mat C2;
  int C_elempack;
  Mat BT_tile;
  int max_kk_1;
  int max_jj;
  int k_1;
  int j;
  int ppk;
  int ppj_1;
  int ppjk;
  int nn_NK;
  int nn_K;
  int nn_N;
  int TILE_K_1;
  int TILE_N_1;
  int TILE_M_1;
  int K_1;
  int N;
  Mat AT_tile;
  int max_kk;
  int max_ii;
  int k;
  int i;
  int ppj;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int K;
  int M;
  Mat *m_1;
  Mat *m;
  undefined4 in_stack_fffffffffffff8e0;
  undefined4 in_stack_fffffffffffff8e4;
  Mat *in_stack_fffffffffffff8e8;
  Mat *in_stack_fffffffffffff8f0;
  Option *in_stack_fffffffffffff8f8;
  Mat *in_stack_fffffffffffff900;
  void **ppvVar7;
  Mat *in_stack_fffffffffffff908;
  undefined4 in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff914;
  undefined4 local_6c4;
  undefined8 in_stack_fffffffffffff940;
  undefined8 in_stack_fffffffffffff948;
  undefined8 *puVar8;
  undefined8 in_stack_fffffffffffff950;
  int *in_stack_fffffffffffff960;
  int *in_stack_fffffffffffff968;
  int *in_stack_fffffffffffff970;
  int iVar9;
  undefined8 in_stack_fffffffffffff978;
  int local_5f8;
  void *local_5f0;
  int *local_5e8;
  void *local_5e0;
  undefined4 local_5d8;
  long *local_5d0;
  undefined4 local_5c8;
  undefined4 local_5c4;
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined4 local_5b8;
  void *local_5b0;
  undefined4 local_5a4;
  undefined8 local_5a0;
  undefined8 local_598;
  undefined8 local_590;
  undefined4 local_588;
  long *local_580;
  undefined4 local_578;
  undefined4 local_574;
  undefined4 local_570;
  undefined4 local_56c;
  undefined4 local_568;
  undefined8 local_560;
  void *local_558;
  int *local_550;
  long local_548;
  undefined4 local_540;
  long *local_538;
  undefined4 local_530;
  int local_52c;
  undefined4 local_528;
  undefined4 local_524;
  undefined4 local_520;
  long local_518;
  int local_510;
  int local_50c;
  int local_508;
  int local_504;
  int local_500;
  int local_4fc;
  int local_4f8;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  int local_4e8;
  int local_4e4;
  int local_4e0;
  int local_4dc [2];
  int local_4d4;
  int local_4d0;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined4 local_4a8;
  long *local_4a0;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  Gemm_x86_avx *in_stack_fffffffffffffb70;
  void *local_478;
  int *local_470;
  long local_468;
  undefined4 local_460;
  long *local_458;
  undefined4 local_450;
  int local_44c;
  undefined4 local_448;
  undefined4 local_444;
  undefined4 local_440;
  long local_438;
  int local_42c;
  int local_428;
  int local_424;
  int local_420;
  int local_41c;
  int local_418;
  int local_414;
  int local_410;
  int local_40c [2];
  int local_404;
  int local_400;
  int local_3fc;
  byte *local_3f8;
  int local_3e4;
  void **local_3e0;
  undefined8 *local_3d8;
  void **local_3c8;
  undefined8 *local_3b8;
  undefined8 in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc64;
  Mat *in_stack_fffffffffffffc68;
  Mat *in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  int in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  Mat *in_stack_fffffffffffffd70;
  Mat *in_stack_fffffffffffffd78;
  
  iVar9 = (int)in_stack_fffffffffffff978;
  if (*(int *)(in_RDI + 0x10c) == 0) {
    local_3f8 = in_RSI;
    if (*(int *)(in_RDI + 0xe0) != 0) {
      local_3fc = *(int *)(in_RDI + 0xec);
      local_400 = *(int *)(in_RDI + 0xf4);
      in_stack_fffffffffffff8e0 = *(undefined4 *)(in_RSI + 4);
      get_optimal_tile_mnk
                ((int)((ulong)in_stack_fffffffffffff950 >> 0x20),(int)in_stack_fffffffffffff950,
                 (int)((ulong)in_stack_fffffffffffff948 >> 0x20),(int)in_stack_fffffffffffff948,
                 (int)((ulong)in_stack_fffffffffffff940 >> 0x20),(int)in_stack_fffffffffffff940,
                 in_stack_fffffffffffff960,in_stack_fffffffffffff968,in_stack_fffffffffffff970,iVar9
                );
      local_410 = (local_3fc + local_404 + -1) / local_404;
      Mat::create(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                  (int)in_stack_fffffffffffff8f8,(int)((ulong)in_stack_fffffffffffff8f0 >> 0x20),
                  (size_t)in_stack_fffffffffffff8e8,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      bVar6 = true;
      if (*(long *)(in_RDI + 0x248) != 0) {
        bVar6 = *(long *)(in_RDI + 0x288) * (long)*(int *)(in_RDI + 0x280) == 0;
      }
      if (bVar6) {
        return -100;
      }
      for (local_414 = 0; iVar9 = (int)in_stack_fffffffffffff978, local_414 < local_410;
          local_414 = local_414 + 1) {
        local_418 = local_414 * local_404;
        for (local_41c = 0; local_41c < local_400; local_41c = local_40c[0] + local_41c) {
          local_424 = local_3fc - local_418;
          piVar3 = std::min<int>(&local_424,&local_404);
          local_420 = *piVar3;
          local_42c = local_400 - local_41c;
          piVar3 = std::min<int>(&local_42c,local_40c);
          local_428 = *piVar3;
          local_44c = *(int *)(in_RDI + 0x274);
          local_468 = *(long *)(in_RDI + 600);
          local_460 = *(undefined4 *)(in_RDI + 0x260);
          local_4a0 = *(long **)(in_RDI + 0x268);
          local_478 = (void *)(*(long *)(in_RDI + 0x248) +
                               *(long *)(in_RDI + 0x288) * (long)(local_418 / local_404) *
                               *(long *)(in_RDI + 600) +
                              (long)local_44c * (long)(local_41c / local_40c[0]) * local_468);
          local_438 = (long)local_44c;
          local_3d8 = &local_4c0;
          local_440 = 1;
          local_444 = 1;
          local_448 = 1;
          local_450 = 2;
          local_470 = (int *)0x0;
          local_4c0 = 0;
          local_4b0 = 0;
          local_4a8 = 0;
          local_4b8 = 0;
          local_458 = local_4a0;
          if (*(int *)(in_RDI + 0xd8) == 0) {
            pack_A_tile(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                        in_stack_fffffffffffffc64,in_stack_fffffffffffffc60,
                        (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                        (int)in_stack_fffffffffffffc58);
          }
          else {
            transpose_pack_A_tile
                      (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c
                       ,in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
                       in_stack_fffffffffffffd60);
          }
          local_3c8 = &local_478;
          if (local_470 != (int *)0x0) {
            LOCK();
            iVar9 = *local_470;
            *local_470 = *local_470 + -1;
            UNLOCK();
            if (iVar9 == 1) {
              if (local_458 == (long *)0x0) {
                if (local_478 != (void *)0x0) {
                  free(local_478);
                }
              }
              else {
                (**(code **)(*local_458 + 0x18))(local_458,local_478);
              }
            }
          }
          local_478 = (void *)0x0;
          local_468 = 0;
          local_460 = 0;
          local_450 = 0;
          local_44c = 0;
          local_448 = 0;
          local_444 = 0;
          local_440 = 0;
          local_438 = 0;
          local_470 = (int *)0x0;
        }
      }
      if ((*local_3f8 & 1) != 0) {
        puVar4 = (undefined8 *)(in_RDI + 0x120);
        if (*(long *)(in_RDI + 0x128) != 0) {
          piVar3 = *(int **)(in_RDI + 0x128);
          LOCK();
          iVar1 = *piVar3;
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (iVar1 == 1) {
            if (*(long *)(in_RDI + 0x140) == 0) {
              if ((void *)*puVar4 != (void *)0x0) {
                free((void *)*puVar4);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x140) + 0x18))(*(long **)(in_RDI + 0x140),*puVar4);
            }
          }
        }
        *puVar4 = 0;
        *(undefined8 *)(in_RDI + 0x130) = 0;
        *(undefined4 *)(in_RDI + 0x138) = 0;
        *(undefined4 *)(in_RDI + 0x148) = 0;
        *(undefined4 *)(in_RDI + 0x14c) = 0;
        *(undefined4 *)(in_RDI + 0x150) = 0;
        *(undefined4 *)(in_RDI + 0x154) = 0;
        *(undefined4 *)(in_RDI + 0x158) = 0;
        *(undefined8 *)(in_RDI + 0x160) = 0;
        *(undefined8 *)(in_RDI + 0x128) = 0;
      }
    }
    if (*(int *)(in_RDI + 0xe4) != 0) {
      local_4d0 = *(int *)(in_RDI + 0xf0);
      local_4d4 = *(int *)(in_RDI + 0xf4);
      in_stack_fffffffffffff8e0 = *(undefined4 *)(local_3f8 + 4);
      get_optimal_tile_mnk
                ((int)((ulong)in_stack_fffffffffffff950 >> 0x20),(int)in_stack_fffffffffffff950,
                 (int)((ulong)in_stack_fffffffffffff948 >> 0x20),(int)in_stack_fffffffffffff948,
                 (int)((ulong)in_stack_fffffffffffff940 >> 0x20),(int)in_stack_fffffffffffff940,
                 in_stack_fffffffffffff960,in_stack_fffffffffffff968,in_stack_fffffffffffff970,iVar9
                );
      local_4e4 = (local_4d0 + local_4dc[0] + -1) / local_4dc[0];
      local_4e8 = (local_4d4 + local_4e0 + -1) / local_4e0;
      Mat::create(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                  (int)in_stack_fffffffffffff8f8,(int)((ulong)in_stack_fffffffffffff8f0 >> 0x20),
                  (size_t)in_stack_fffffffffffff8e8,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      bVar6 = true;
      if (*(long *)(in_RDI + 0x290) != 0) {
        bVar6 = *(long *)(in_RDI + 0x2d0) * (long)*(int *)(in_RDI + 0x2c8) == 0;
      }
      if (bVar6) {
        return -100;
      }
      local_4ec = local_4e4 * local_4e8;
      for (local_4f0 = 0; local_4f0 < local_4ec; local_4f0 = local_4f0 + 1) {
        local_4f4 = local_4f0 / local_4e8;
        local_4f8 = local_4f0 % local_4e8;
        local_4fc = local_4f4 * local_4dc[0];
        local_500 = local_4f8 * local_4e0;
        local_508 = local_4d0 - local_4fc;
        piVar3 = std::min<int>(&local_508,local_4dc);
        local_504 = *piVar3;
        local_510 = local_4d4 - local_500;
        piVar3 = std::min<int>(&local_510,&local_4e0);
        local_50c = *piVar3;
        local_52c = *(int *)(in_RDI + 700);
        local_548 = *(long *)(in_RDI + 0x2a0);
        local_540 = *(undefined4 *)(in_RDI + 0x2a8);
        local_580 = *(long **)(in_RDI + 0x2b0);
        local_558 = (void *)(*(long *)(in_RDI + 0x290) +
                             *(long *)(in_RDI + 0x2d0) * (long)(local_4fc / local_4dc[0]) *
                             *(long *)(in_RDI + 0x2a0) +
                            (long)local_52c * (long)(local_500 / local_4e0) * local_548);
        local_518 = (long)local_52c;
        local_3b8 = &local_5a0;
        local_520 = 1;
        local_524 = 1;
        local_528 = 1;
        local_530 = 2;
        local_550 = (int *)0x0;
        local_5a0 = 0;
        local_590 = 0;
        local_588 = 0;
        local_578 = 0;
        local_574 = 0;
        local_570 = 0;
        local_56c = 0;
        local_568 = 0;
        local_560 = 0;
        local_598 = 0;
        local_538 = local_580;
        if (*(int *)(in_RDI + 0xdc) == 0) {
          transpose_pack_B_tile
                    (in_stack_000000a0,in_stack_00000098,in_stack_00000094,in_stack_00000090,
                     in_stack_0000008c,in_stack_00000088);
        }
        else {
          pack_B_tile((Mat *)C2.allocator,(Mat *)C2._24_8_,C2.elemsize._4_4_,(int)C2.elemsize,
                      C2.refcount._4_4_,(int)C2.refcount);
        }
        if (local_550 != (int *)0x0) {
          LOCK();
          iVar9 = *local_550;
          *local_550 = *local_550 + -1;
          UNLOCK();
          if (iVar9 == 1) {
            if (local_538 == (long *)0x0) {
              if (local_558 != (void *)0x0) {
                free(local_558);
              }
            }
            else {
              (**(code **)(*local_538 + 0x18))(local_538,local_558);
            }
          }
        }
        local_558 = (void *)0x0;
        local_548 = 0;
        local_540 = 0;
        local_530 = 0;
        local_52c = 0;
        local_528 = 0;
        local_524 = 0;
        local_520 = 0;
        local_518 = 0;
        local_550 = (int *)0x0;
      }
      if ((*local_3f8 & 1) != 0) {
        puVar4 = (undefined8 *)(in_RDI + 0x168);
        if (*(long *)(in_RDI + 0x170) != 0) {
          piVar3 = *(int **)(in_RDI + 0x170);
          LOCK();
          iVar9 = *piVar3;
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (iVar9 == 1) {
            if (*(long *)(in_RDI + 0x188) == 0) {
              if ((void *)*puVar4 != (void *)0x0) {
                free((void *)*puVar4);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x188) + 0x18))(*(long **)(in_RDI + 0x188),*puVar4);
            }
          }
        }
        *puVar4 = 0;
        puVar4[2] = 0;
        *(undefined4 *)(puVar4 + 3) = 0;
        *(undefined4 *)(puVar4 + 5) = 0;
        *(undefined4 *)((long)puVar4 + 0x2c) = 0;
        *(undefined4 *)(puVar4 + 6) = 0;
        *(undefined4 *)((long)puVar4 + 0x34) = 0;
        *(undefined4 *)(puVar4 + 7) = 0;
        puVar4[8] = 0;
        puVar4[1] = 0;
      }
    }
    iVar9 = (int)((ulong)in_stack_fffffffffffff900 >> 0x20);
    if ((*(int *)(in_RDI + 0xe8) != 0) && (*(int *)(in_RDI + 0xf8) != -1)) {
      puVar4 = (undefined8 *)(in_RDI + 0x2d8);
      if (puVar4 != (undefined8 *)(in_RDI + 0x1b0)) {
        if (*(long *)(in_RDI + 0x1b8) != 0) {
          LOCK();
          **(int **)(in_RDI + 0x1b8) = **(int **)(in_RDI + 0x1b8) + 1;
          UNLOCK();
        }
        puVar8 = puVar4;
        if (*(long *)(in_RDI + 0x2e0) != 0) {
          piVar3 = *(int **)(in_RDI + 0x2e0);
          LOCK();
          iVar1 = *piVar3;
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (iVar1 == 1) {
            if (*(long *)(in_RDI + 0x2f8) == 0) {
              if ((void *)*puVar4 != (void *)0x0) {
                free((void *)*puVar4);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x2f8) + 0x18))(*(long **)(in_RDI + 0x2f8),*puVar4);
            }
          }
        }
        *puVar4 = 0;
        puVar4[2] = 0;
        *(undefined4 *)(puVar4 + 3) = 0;
        *(undefined4 *)(puVar4 + 5) = 0;
        *(undefined4 *)((long)puVar4 + 0x2c) = 0;
        *(undefined4 *)(puVar4 + 6) = 0;
        *(undefined4 *)((long)puVar4 + 0x34) = 0;
        *(undefined4 *)(puVar4 + 7) = 0;
        puVar4[8] = 0;
        puVar4[1] = 0;
        *puVar8 = *(undefined8 *)(in_RDI + 0x1b0);
        puVar8[1] = *(undefined8 *)(in_RDI + 0x1b8);
        puVar8[2] = *(undefined8 *)(in_RDI + 0x1c0);
        *(undefined4 *)(puVar8 + 3) = *(undefined4 *)(in_RDI + 0x1c8);
        puVar8[4] = *(undefined8 *)(in_RDI + 0x1d0);
        *(undefined4 *)(puVar8 + 5) = *(undefined4 *)(in_RDI + 0x1d8);
        *(undefined4 *)((long)puVar8 + 0x2c) = *(undefined4 *)(in_RDI + 0x1dc);
        *(undefined4 *)(puVar8 + 6) = *(undefined4 *)(in_RDI + 0x1e0);
        *(undefined4 *)((long)puVar8 + 0x34) = *(undefined4 *)(in_RDI + 0x1e4);
        *(undefined4 *)(puVar8 + 7) = *(undefined4 *)(in_RDI + 0x1e8);
        puVar8[8] = *(undefined8 *)(in_RDI + 0x1f0);
      }
      if ((*(int *)(in_RDI + 0xf8) == 3) && ((local_3f8[0x27] & 1) != 0)) {
        if (*(int *)(in_RDI + 0xec) % 8 == 0) {
          local_6c4 = 8;
        }
        else {
          local_6c4 = 1;
          if (*(int *)(in_RDI + 0xec) % 4 == 0) {
            local_6c4 = 4;
          }
        }
        local_5a4 = local_6c4;
        convert_packing((Mat *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                        in_stack_fffffffffffff908,iVar9,in_stack_fffffffffffff8f8);
      }
      if ((*(float *)(in_RDI + 0xd4) != 1.0) || (NAN(*(float *)(in_RDI + 0xd4)))) {
        local_3e0 = &local_5f0;
        local_5f0 = (void *)0x0;
        local_5e8 = (int *)0x0;
        local_5e0 = (void *)0x0;
        local_5d8 = 0;
        local_5d0 = (long *)0x0;
        local_5c8 = 0;
        local_5c4 = 0;
        local_5c0 = 0;
        local_5bc = 0;
        local_5b8 = 0;
        local_5b0 = (void *)0x0;
        Mat::create_like(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                         (Allocator *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0))
        ;
        uVar2 = *(undefined8 *)(in_RDI + 0x318);
        iVar9 = *(int *)(in_RDI + 0x310);
        iVar1 = *(int *)(in_RDI + 0x2f0);
        for (local_5f8 = 0; local_5f8 < (int)uVar2 * iVar9 * iVar1; local_5f8 = local_5f8 + 1) {
          *(float *)((long)local_5f0 + (long)local_5f8 * 4) =
               *(float *)(*(long *)(in_RDI + 0x2d8) + (long)local_5f8 * 4) *
               *(float *)(in_RDI + 0xd4);
        }
        ppvVar5 = (void **)(in_RDI + 0x2d8);
        if (ppvVar5 != &local_5f0) {
          if (local_5e8 != (int *)0x0) {
            LOCK();
            *local_5e8 = *local_5e8 + 1;
            UNLOCK();
          }
          ppvVar7 = ppvVar5;
          if (*(long *)(in_RDI + 0x2e0) != 0) {
            piVar3 = *(int **)(in_RDI + 0x2e0);
            LOCK();
            iVar9 = *piVar3;
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (iVar9 == 1) {
              if (*(long *)(in_RDI + 0x2f8) == 0) {
                if (*ppvVar5 != (void *)0x0) {
                  free(*ppvVar5);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x2f8) + 0x18))
                          (*(long **)(in_RDI + 0x2f8),*ppvVar5);
              }
            }
          }
          *ppvVar5 = (void *)0x0;
          ppvVar5[2] = (void *)0x0;
          *(undefined4 *)(ppvVar5 + 3) = 0;
          *(undefined4 *)(ppvVar5 + 5) = 0;
          *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
          *(undefined4 *)(ppvVar5 + 6) = 0;
          *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
          *(undefined4 *)(ppvVar5 + 7) = 0;
          ppvVar5[8] = (void *)0x0;
          ppvVar5[1] = (void *)0x0;
          *ppvVar7 = local_5f0;
          ppvVar7[1] = local_5e8;
          ppvVar7[2] = local_5e0;
          *(undefined4 *)(ppvVar7 + 3) = local_5d8;
          ppvVar7[4] = local_5d0;
          *(undefined4 *)(ppvVar7 + 5) = local_5c8;
          *(undefined4 *)((long)ppvVar7 + 0x2c) = local_5c4;
          *(undefined4 *)(ppvVar7 + 6) = local_5c0;
          *(undefined4 *)((long)ppvVar7 + 0x34) = local_5bc;
          *(undefined4 *)(ppvVar7 + 7) = local_5b8;
          ppvVar7[8] = local_5b0;
        }
        ppvVar5 = &local_5f0;
        if (local_5e8 != (int *)0x0) {
          LOCK();
          iVar9 = *local_5e8;
          *local_5e8 = *local_5e8 + -1;
          UNLOCK();
          if (iVar9 == 1) {
            if (local_5d0 == (long *)0x0) {
              if (local_5f0 != (void *)0x0) {
                free(local_5f0);
              }
            }
            else {
              (**(code **)(*local_5d0 + 0x18))(local_5d0,local_5f0);
            }
          }
        }
        *ppvVar5 = (void *)0x0;
        ppvVar5[2] = (void *)0x0;
        *(undefined4 *)(ppvVar5 + 3) = 0;
        *(undefined4 *)(ppvVar5 + 5) = 0;
        *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
        *(undefined4 *)(ppvVar5 + 6) = 0;
        *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
        *(undefined4 *)(ppvVar5 + 7) = 0;
        ppvVar5[8] = (void *)0x0;
        ppvVar5[1] = (void *)0x0;
      }
      if ((*local_3f8 & 1) != 0) {
        puVar4 = (undefined8 *)(in_RDI + 0x1b0);
        if (*(long *)(in_RDI + 0x1b8) != 0) {
          piVar3 = *(int **)(in_RDI + 0x1b8);
          LOCK();
          iVar9 = *piVar3;
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (iVar9 == 1) {
            if (*(long *)(in_RDI + 0x1d0) == 0) {
              if ((void *)*puVar4 != (void *)0x0) {
                free((void *)*puVar4);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x1d0) + 0x18))(*(long **)(in_RDI + 0x1d0),*puVar4);
            }
          }
        }
        *puVar4 = 0;
        puVar4[2] = 0;
        *(undefined4 *)(puVar4 + 3) = 0;
        *(undefined4 *)(puVar4 + 5) = 0;
        *(undefined4 *)((long)puVar4 + 0x2c) = 0;
        *(undefined4 *)(puVar4 + 6) = 0;
        *(undefined4 *)((long)puVar4 + 0x34) = 0;
        *(undefined4 *)(puVar4 + 7) = 0;
        puVar4[8] = 0;
        puVar4[1] = 0;
      }
    }
    if (((*(int *)(in_RDI + 0xe0) != 0) || (*(int *)(in_RDI + 0xe4) != 0)) ||
       (*(int *)(in_RDI + 0xe8) != 0)) {
      *(undefined4 *)(in_RDI + 0x244) = *(undefined4 *)(local_3f8 + 4);
    }
    local_3e4 = 0;
  }
  else {
    local_3e4 = create_pipeline_int8
                          (in_stack_fffffffffffffb70,
                           (Option *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  }
  return local_3e4;
}

Assistant:

int Gemm_x86_avx::create_pipeline(const Option& opt)
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return create_pipeline_int8(opt);
    }
#endif

    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

        AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            A_data.release();
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;
        const int nn_K = (K + TILE_K - 1) / TILE_K;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        const int nn_NK = nn_N * nn_K;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

            if (transB)
            {
                pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
            else
            {
                transpose_pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
        }

        if (opt.lightmode)
            B_data.release();
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

#if __SSE2__
        if (constant_broadcast_type_C == 3 && opt.use_packing_layout)
        {
#if __AVX512F__
            int C_elempack = constantM % 16 == 0 ? 16 : constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#elif __AVX__
            int C_elempack = constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#else
            int C_elempack = constantM % 4 == 0 ? 4 : 1;
#endif
            convert_packing(C_data, CT_data, C_elempack, opt);
        }
#endif // __SSE2__

        // pre-multiply C with beta
        if (beta != 1.f)
        {
            Mat C2;
            C2.create_like(CT_data);

            const int size = CT_data.total() * CT_data.elempack;
            for (int i = 0; i < size; i++)
            {
                C2[i] = CT_data[i] * beta;
            }

            CT_data = C2;
        }

        if (opt.lightmode)
            C_data.release();
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}